

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.cc
# Opt level: O0

void __thiscall Dir::~Dir(Dir *this)

{
  string *in_RDI;
  
  closedir(*(DIR **)(in_RDI + 0x20));
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

Dir::~Dir() {
  closedir(dir_);
}